

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

void __thiscall
llvm::FoldingSetIteratorImpl::FoldingSetIteratorImpl(FoldingSetIteratorImpl *this,void **Bucket)

{
  FoldingSetNode *pFVar1;
  
  for (; (pFVar1 = (FoldingSetNode *)*Bucket, pFVar1 == (FoldingSetNode *)0x0 ||
         ((pFVar1 != (FoldingSetNode *)0xffffffffffffffff &&
          (pFVar1 == (FoldingSetNode *)0x0 || ((ulong)pFVar1 & 1) != 0)))); Bucket = Bucket + 1) {
  }
  this->NodePtr = pFVar1;
  return;
}

Assistant:

FoldingSetIteratorImpl::FoldingSetIteratorImpl(void **Bucket) {
  // Skip to the first non-null non-self-cycle bucket.
  while (*Bucket != reinterpret_cast<void*>(-1) &&
         (!*Bucket || !GetNextPtr(*Bucket)))
    ++Bucket;

  NodePtr = static_cast<FoldingSetNode*>(*Bucket);
}